

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

string * __thiscall
Hospital::Getter_Username_abi_cxx11_(string *__return_storage_ptr__,Hospital *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string Hospital ::Getter_Username(){
    return Admin_Username;
}